

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_image *
rf_gen_image_gradient_radial_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,float density,rf_color inner,
          rf_color outer,rf_color *dst,rf_int dst_size)

{
  int iVar1;
  float fVar2;
  float local_8c;
  undefined4 uStack_54;
  float factor;
  float dist;
  rf_int x;
  rf_int y;
  float center_y;
  float center_x;
  float radius;
  rf_color *dst_local;
  float density_local;
  int height_local;
  int width_local;
  rf_color outer_local;
  rf_color inner_local;
  
  memset(__return_storage_ptr__,0,0x18);
  iVar1 = rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8);
  if (width * height * iVar1 <= dst_size) {
    if (width < height) {
      local_8c = (float)width;
    }
    else {
      local_8c = (float)height;
    }
    local_8c = local_8c / 2.0;
    for (x = 0; x < height; x = x + 1) {
      for (_factor = 0; _factor < width; _factor = _factor + 1) {
        fVar2 = hypotf((float)_factor - (float)width / 2.0,(float)x - (float)height / 2.0);
        fVar2 = (fVar2 - local_8c * density) / (local_8c * (1.0 - density));
        if (fVar2 <= 0.0) {
          fVar2 = 0.0;
        }
        if (1.0 <= fVar2) {
          fVar2 = 1.0;
        }
        dst[x * width + _factor].r =
             (uchar)(int)((float)((uint)outer & 0xff) * fVar2 +
                         (float)((uint)inner & 0xff) * (1.0 - fVar2));
        dst[x * width + _factor].g =
             (uchar)(int)((float)((uint)outer >> 8 & 0xff) * fVar2 +
                         (float)((uint)inner >> 8 & 0xff) * (1.0 - fVar2));
        dst[x * width + _factor].b =
             (uchar)(int)((float)((uint)outer >> 0x10 & 0xff) * fVar2 +
                         (float)((uint)inner >> 0x10 & 0xff) * (1.0 - fVar2));
        dst[x * width + _factor].a =
             (uchar)(int)((float)((uint)outer >> 0x18) * fVar2 +
                         (float)((uint)inner >> 0x18) * (1.0 - fVar2));
      }
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = 7;
    __return_storage_ptr__->valid = true;
    *(undefined3 *)&__return_storage_ptr__->field_0x15 = uStack_54._1_3_;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_radial_to_buffer(int width, int height, float density, rf_color inner, rf_color outer, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        float radius = (width < height) ? ((float)width) / 2.0f : ((float)height) / 2.0f;

        float center_x = ((float)width ) / 2.0f;
        float center_y = ((float)height) / 2.0f;

        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                float dist   = hypotf((float)x - center_x, (float)y - center_y);
                float factor = (dist - radius * density) / (radius * (1.0f - density));

                factor = (float)fmax(factor, 0.f);
                factor = (float)fmin(factor, 1.f); // dist can be bigger than radius so we have to check

                dst[y * width + x].r = (int)((float)outer.r * factor + (float)inner.r * (1.0f - factor));
                dst[y * width + x].g = (int)((float)outer.g * factor + (float)inner.g * (1.0f - factor));
                dst[y * width + x].b = (int)((float)outer.b * factor + (float)inner.b * (1.0f - factor));
                dst[y * width + x].a = (int)((float)outer.a * factor + (float)inner.a * (1.0f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}